

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void blend_a64_d16_mask_w16_sse41
               (uint8_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *m0,__m128i *m1,
               __m128i *v_round_offset,__m128i *v_maxval,int shift)

{
  __m128i alVar1;
  __m128i alVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  sVar3 = (short)(*v_maxval)[0];
  sVar4 = *(short *)((long)*v_maxval + 2);
  sVar5 = *(short *)((long)*v_maxval + 4);
  sVar6 = *(short *)((long)*v_maxval + 6);
  sVar7 = (short)(*v_maxval)[1];
  sVar8 = *(short *)((long)*v_maxval + 10);
  sVar9 = *(short *)((long)*v_maxval + 0xc);
  sVar10 = *(short *)((long)*v_maxval + 0xe);
  alVar1 = *m0;
  alVar2 = *m1;
  auVar23 = *(undefined1 (*) [16])src0;
  auVar36 = *(undefined1 (*) [16])(src0 + 8);
  auVar46._0_12_ = auVar23._0_12_;
  auVar46._12_2_ = auVar23._6_2_;
  auVar46._14_2_ = src1[3];
  auVar45._12_4_ = auVar46._12_4_;
  auVar45._0_10_ = auVar23._0_10_;
  auVar45._10_2_ = src1[2];
  auVar44._10_6_ = auVar45._10_6_;
  auVar44._0_8_ = auVar23._0_8_;
  auVar44._8_2_ = auVar23._4_2_;
  auVar43._8_8_ = auVar44._8_8_;
  auVar43._6_2_ = src1[1];
  auVar43._4_2_ = auVar23._2_2_;
  auVar43._0_2_ = auVar23._0_2_;
  auVar43._2_2_ = *src1;
  auVar26._0_12_ = alVar1._0_12_;
  auVar26._12_2_ = alVar1[0]._6_2_;
  auVar26._14_2_ = sVar6 - alVar1[0]._6_2_;
  auVar25._12_4_ = auVar26._12_4_;
  auVar25._0_10_ = alVar1._0_10_;
  auVar25._10_2_ = sVar5 - alVar1[0]._4_2_;
  auVar42._10_6_ = auVar25._10_6_;
  auVar42._0_8_ = alVar1[0];
  auVar42._8_2_ = alVar1[0]._4_2_;
  auVar24._8_8_ = auVar42._8_8_;
  auVar24._6_2_ = sVar4 - alVar1[0]._2_2_;
  auVar24._4_2_ = alVar1[0]._2_2_;
  auVar24._2_2_ = sVar3 - (short)alVar1[0];
  auVar24._0_2_ = (short)alVar1[0];
  auVar27 = pmaddwd(auVar24,auVar43);
  auVar37._2_2_ = src1[4];
  auVar37._0_2_ = auVar23._8_2_;
  auVar37._4_2_ = auVar23._10_2_;
  auVar37._6_2_ = src1[5];
  auVar37._8_2_ = auVar23._12_2_;
  auVar37._10_2_ = src1[6];
  auVar37._12_2_ = auVar23._14_2_;
  auVar37._14_2_ = src1[7];
  auVar23._2_2_ = sVar7 - (short)alVar1[1];
  auVar23._0_2_ = (short)alVar1[1];
  auVar23._4_2_ = alVar1[1]._2_2_;
  auVar23._6_2_ = sVar8 - alVar1[1]._2_2_;
  auVar23._8_2_ = alVar1[1]._4_2_;
  auVar23._10_2_ = sVar9 - alVar1[1]._4_2_;
  auVar23._12_2_ = alVar1[1]._6_2_;
  auVar23._14_2_ = sVar10 - alVar1[1]._6_2_;
  auVar23 = pmaddwd(auVar23,auVar37);
  auVar41._0_12_ = auVar36._0_12_;
  auVar41._12_2_ = auVar36._6_2_;
  auVar41._14_2_ = src1[0xb];
  auVar40._12_4_ = auVar41._12_4_;
  auVar40._0_10_ = auVar36._0_10_;
  auVar40._10_2_ = src1[10];
  auVar39._10_6_ = auVar40._10_6_;
  auVar39._0_8_ = auVar36._0_8_;
  auVar39._8_2_ = auVar36._4_2_;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38._6_2_ = src1[9];
  auVar38._4_2_ = auVar36._2_2_;
  auVar38._0_2_ = auVar36._0_2_;
  auVar38._2_2_ = src1[8];
  auVar33._0_12_ = alVar2._0_12_;
  auVar33._12_2_ = alVar2[0]._6_2_;
  auVar33._14_2_ = sVar6 - alVar2[0]._6_2_;
  auVar32._12_4_ = auVar33._12_4_;
  auVar32._0_10_ = alVar2._0_10_;
  auVar32._10_2_ = sVar5 - alVar2[0]._4_2_;
  auVar31._10_6_ = auVar32._10_6_;
  auVar31._0_8_ = alVar2[0];
  auVar31._8_2_ = alVar2[0]._4_2_;
  auVar30._8_8_ = auVar31._8_8_;
  auVar30._6_2_ = sVar4 - alVar2[0]._2_2_;
  auVar30._4_2_ = alVar2[0]._2_2_;
  auVar30._2_2_ = sVar3 - (short)alVar2[0];
  auVar30._0_2_ = (short)alVar2[0];
  auVar34 = pmaddwd(auVar30,auVar38);
  iVar19 = (int)(*v_round_offset)[0];
  iVar20 = *(int *)((long)*v_round_offset + 4);
  iVar21 = (int)(*v_round_offset)[1];
  iVar22 = *(int *)((long)*v_round_offset + 0xc);
  auVar42 = ZEXT416((uint)shift);
  auVar28._0_4_ = auVar27._0_4_ - iVar19 >> auVar42;
  auVar28._4_4_ = auVar27._4_4_ - iVar20 >> auVar42;
  auVar28._8_4_ = auVar27._8_4_ - iVar21 >> auVar42;
  auVar28._12_4_ = auVar27._12_4_ - iVar22 >> auVar42;
  auVar29._2_2_ = src1[0xc];
  auVar29._0_2_ = auVar36._8_2_;
  auVar29._4_2_ = auVar36._10_2_;
  auVar29._6_2_ = src1[0xd];
  auVar29._8_2_ = auVar36._12_2_;
  auVar29._10_2_ = src1[0xe];
  auVar29._12_2_ = auVar36._14_2_;
  auVar29._14_2_ = src1[0xf];
  auVar36._0_4_ = auVar23._0_4_ - iVar19 >> auVar42;
  auVar36._4_4_ = auVar23._4_4_ - iVar20 >> auVar42;
  auVar36._8_4_ = auVar23._8_4_ - iVar21 >> auVar42;
  auVar36._12_4_ = auVar23._12_4_ - iVar22 >> auVar42;
  auVar27._2_2_ = sVar7 - (short)alVar2[1];
  auVar27._0_2_ = (short)alVar2[1];
  auVar27._4_2_ = alVar2[1]._2_2_;
  auVar27._6_2_ = sVar8 - alVar2[1]._2_2_;
  auVar27._8_2_ = alVar2[1]._4_2_;
  auVar27._10_2_ = sVar9 - alVar2[1]._4_2_;
  auVar27._12_2_ = alVar2[1]._6_2_;
  auVar27._14_2_ = sVar10 - alVar2[1]._6_2_;
  auVar35._0_4_ = auVar34._0_4_ - iVar19 >> auVar42;
  auVar35._4_4_ = auVar34._4_4_ - iVar20 >> auVar42;
  auVar35._8_4_ = auVar34._8_4_ - iVar21 >> auVar42;
  auVar35._12_4_ = auVar34._12_4_ - iVar22 >> auVar42;
  auVar23 = pmaddwd(auVar27,auVar29);
  auVar34._0_4_ = auVar23._0_4_ - iVar19 >> auVar42;
  auVar34._4_4_ = auVar23._4_4_ - iVar20 >> auVar42;
  auVar34._8_4_ = auVar23._8_4_ - iVar21 >> auVar42;
  auVar34._12_4_ = auVar23._12_4_ - iVar22 >> auVar42;
  auVar23 = packssdw(auVar28,auVar36);
  auVar36 = packssdw(auVar35,auVar34);
  sVar3 = auVar23._0_2_;
  sVar4 = auVar23._2_2_;
  sVar5 = auVar23._4_2_;
  sVar6 = auVar23._6_2_;
  sVar7 = auVar23._8_2_;
  sVar8 = auVar23._10_2_;
  sVar9 = auVar23._12_2_;
  sVar10 = auVar23._14_2_;
  sVar11 = auVar36._0_2_;
  sVar12 = auVar36._2_2_;
  sVar13 = auVar36._4_2_;
  sVar14 = auVar36._6_2_;
  sVar15 = auVar36._8_2_;
  sVar16 = auVar36._10_2_;
  sVar17 = auVar36._12_2_;
  sVar18 = auVar36._14_2_;
  *dst = (0 < sVar3) * (sVar3 < 0x100) * auVar23[0] - (0xff < sVar3);
  dst[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar23[2] - (0xff < sVar4);
  dst[2] = (0 < sVar5) * (sVar5 < 0x100) * auVar23[4] - (0xff < sVar5);
  dst[3] = (0 < sVar6) * (sVar6 < 0x100) * auVar23[6] - (0xff < sVar6);
  dst[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar23[8] - (0xff < sVar7);
  dst[5] = (0 < sVar8) * (sVar8 < 0x100) * auVar23[10] - (0xff < sVar8);
  dst[6] = (0 < sVar9) * (sVar9 < 0x100) * auVar23[0xc] - (0xff < sVar9);
  dst[7] = (0 < sVar10) * (sVar10 < 0x100) * auVar23[0xe] - (0xff < sVar10);
  dst[8] = (0 < sVar11) * (sVar11 < 0x100) * auVar36[0] - (0xff < sVar11);
  dst[9] = (0 < sVar12) * (sVar12 < 0x100) * auVar36[2] - (0xff < sVar12);
  dst[10] = (0 < sVar13) * (sVar13 < 0x100) * auVar36[4] - (0xff < sVar13);
  dst[0xb] = (0 < sVar14) * (sVar14 < 0x100) * auVar36[6] - (0xff < sVar14);
  dst[0xc] = (0 < sVar15) * (sVar15 < 0x100) * auVar36[8] - (0xff < sVar15);
  dst[0xd] = (0 < sVar16) * (sVar16 < 0x100) * auVar36[10] - (0xff < sVar16);
  dst[0xe] = (0 < sVar17) * (sVar17 < 0x100) * auVar36[0xc] - (0xff < sVar17);
  dst[0xf] = (0 < sVar18) * (sVar18 < 0x100) * auVar36[0xe] - (0xff < sVar18);
  return;
}

Assistant:

static inline void blend_a64_d16_mask_w16_sse41(
    uint8_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *m0, const __m128i *m1, const __m128i *v_round_offset,
    const __m128i *v_maxval, int shift) {
  const __m128i max_minus_m0 = _mm_sub_epi16(*v_maxval, *m0);
  const __m128i max_minus_m1 = _mm_sub_epi16(*v_maxval, *m1);
  const __m128i s0_0 = xx_loadu_128(src0);
  const __m128i s0_1 = xx_loadu_128(src0 + 8);
  const __m128i s1_0 = xx_loadu_128(src1);
  const __m128i s1_1 = xx_loadu_128(src1 + 8);
  __m128i res0_lo = _mm_madd_epi16(_mm_unpacklo_epi16(s0_0, s1_0),
                                   _mm_unpacklo_epi16(*m0, max_minus_m0));
  __m128i res0_hi = _mm_madd_epi16(_mm_unpackhi_epi16(s0_0, s1_0),
                                   _mm_unpackhi_epi16(*m0, max_minus_m0));
  __m128i res1_lo = _mm_madd_epi16(_mm_unpacklo_epi16(s0_1, s1_1),
                                   _mm_unpacklo_epi16(*m1, max_minus_m1));
  __m128i res1_hi = _mm_madd_epi16(_mm_unpackhi_epi16(s0_1, s1_1),
                                   _mm_unpackhi_epi16(*m1, max_minus_m1));
  res0_lo = _mm_srai_epi32(_mm_sub_epi32(res0_lo, *v_round_offset), shift);
  res0_hi = _mm_srai_epi32(_mm_sub_epi32(res0_hi, *v_round_offset), shift);
  res1_lo = _mm_srai_epi32(_mm_sub_epi32(res1_lo, *v_round_offset), shift);
  res1_hi = _mm_srai_epi32(_mm_sub_epi32(res1_hi, *v_round_offset), shift);
  const __m128i res0 = _mm_packs_epi32(res0_lo, res0_hi);
  const __m128i res1 = _mm_packs_epi32(res1_lo, res1_hi);
  const __m128i res = _mm_packus_epi16(res0, res1);

  _mm_storeu_si128((__m128i *)(dst), res);
}